

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O1

TrimPositions QStringAlgorithms<const_QLatin1String>::trimmed_helper_positions(QLatin1String *str)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  TrimPositions TVar5;
  
  pbVar2 = (byte *)str->m_data;
  pbVar1 = pbVar2 + str->m_size;
  do {
    pbVar4 = pbVar1;
    pbVar3 = pbVar2;
    if ((pbVar4 <= pbVar2) || (0x3f < pbVar4[-1])) break;
    pbVar1 = pbVar4 + -1;
  } while ((1L << (pbVar4[-1] & 0x3f) & 0x100003e00U) != 0);
  while (((pbVar2 < pbVar4 && (pbVar3 = pbVar2, *pbVar2 < 0x40)) &&
         ((1L << (*pbVar2 & 0x3f) & 0x100003e00U) != 0))) {
    pbVar2 = pbVar2 + 1;
    pbVar3 = pbVar4;
  }
  TVar5.end = (Char *)pbVar4;
  TVar5.begin = (Char *)pbVar3;
  return TVar5;
}

Assistant:

[[nodiscard]] static TrimPositions trimmed_helper_positions(const StringType &str)
    {
        const Char *begin = str.cbegin();
        const Char *end = str.cend();
        // skip white space from end
        while (begin < end && isSpace(end[-1]))
            --end;
        // skip white space from start
        while (begin < end && isSpace(*begin))
            begin++;
        return {begin, end};
    }